

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUISetting.cpp
# Opt level: O3

void __thiscall GUISetting::GUISetting(GUISetting *this,Fifteen *owner,BoardMode boardMode)

{
  OptionsData *__k;
  _Rb_tree_header *p_Var1;
  GUISetting *pGVar2;
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
  *p_Var3;
  _Rb_tree<GraphicMode,std::pair<GraphicMode_const,QRadioButton>,std::_Select1st<std::pair<GraphicMode_const,QRadioButton>>,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
  *p_Var4;
  _Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
  *this_00;
  _Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
  *this_01;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  QButtonGroup *pQVar9;
  QVBoxLayout *pQVar10;
  mapped_type *pmVar11;
  QGroupBox *this_02;
  QSlider *pQVar12;
  QGridLayout *this_03;
  QLabel *pQVar13;
  QGroupBox *this_04;
  QPushButton *this_05;
  QHBoxLayout *this_06;
  int iVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QVBoxLayout layWindow;
  QString local_c8;
  GUISetting *local_b0;
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  NumberColor local_98;
  undefined4 uStack_94;
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
  *local_80;
  _Base_ptr local_78;
  _Rb_tree<GraphicMode,std::pair<GraphicMode_const,QRadioButton>,std::_Select1st<std::pair<GraphicMode_const,QRadioButton>>,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
  *local_70;
  _Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
  *local_68;
  _Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
  *local_60;
  QString local_58;
  _Base_ptr local_40;
  QObject local_38 [8];
  
  QDialog::QDialog(&this->super_QDialog,0,0);
  *(undefined ***)this = &PTR_metaObject_001207c0;
  *(undefined ***)&this->field_0x10 = &PTR__GUISetting_00120998;
  local_70 = (_Rb_tree<GraphicMode,std::pair<GraphicMode_const,QRadioButton>,std::_Select1st<std::pair<GraphicMode_const,QRadioButton>>,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
              *)&this->mapGraphicMode;
  p_Var1 = &(this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header;
  (this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = (_Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
              *)&this->mapImageToLoad;
  p_Var1 = &(this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header;
  (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = (_Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
              *)&this->mapNumberOnImage;
  local_78 = &(this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_78;
  (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_78;
  (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = (_Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
              *)&this->mapTileColor;
  local_40 = &(this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_40;
  (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_40;
  (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->owner = owner;
  this->boardMode = boardMode;
  local_b0 = this;
  QDialog::setModal(SUB81(this,0));
  QVar15.m_data = (storage_type *)0x0;
  QVar15.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar15);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  QWidget::setWindowTitle((QString *)local_b0);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  local_a8 = (QArrayData *)0x6400000064;
  pcStack_a0 = (char16_t *)0x293000001f3;
  QWidget::setGeometry((QRect *)local_b0);
  QWidget::setMaximumSize((int)local_b0,400);
  QWidget::setMinimumSize((int)local_b0,400);
  QWidget::setAttribute((WidgetAttribute)local_b0,true);
  Options::readOptions();
  p_Var4 = local_70;
  (local_b0->currentOptions).numberColor = local_98;
  *(QArrayData **)&local_b0->currentOptions = local_a8;
  *(char16_t **)&(local_b0->currentOptions).squareColor = pcStack_a0;
  local_a8 = (QArrayData *)((ulong)local_a8 & 0xffffffff00000000);
  std::
  _Rb_tree<GraphicMode,std::pair<GraphicMode_const,QRadioButton>,std::_Select1st<std::pair<GraphicMode_const,QRadioButton>>,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
  ::_M_emplace_unique<GraphicMode,char_const(&)[14]>
            (local_70,(GraphicMode *)&local_a8,(char (*) [14])"Scalled image");
  local_58.d.d = (Data *)((ulong)local_58.d.d._4_4_ << 0x20);
  pmVar5 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[]((map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
                         *)p_Var4,(key_type *)&local_58);
  QVar16.m_data = (storage_type *)0x10;
  QVar16.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar16);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  QWidget::setStyleSheet((QString *)pmVar5);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  p_Var4 = local_70;
  local_a8 = (QArrayData *)CONCAT44(local_a8._4_4_,1);
  std::
  _Rb_tree<GraphicMode,std::pair<GraphicMode_const,QRadioButton>,std::_Select1st<std::pair<GraphicMode_const,QRadioButton>>,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
  ::_M_emplace_unique<GraphicMode,char_const(&)[14]>
            (local_70,(GraphicMode *)&local_a8,(char (*) [14])"Cropped image");
  local_58.d.d = (Data *)CONCAT44(local_58.d.d._4_4_,1);
  pmVar5 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[]((map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
                         *)p_Var4,(key_type *)&local_58);
  QVar17.m_data = (storage_type *)0x10;
  QVar17.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar17);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  QWidget::setStyleSheet((QString *)pmVar5);
  __k = &local_b0->currentOptions;
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  pmVar5 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[]((map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
                         *)local_70,&__k->graphicMode);
  QAbstractButton::setChecked(SUB81(pmVar5,0));
  p_Var3 = local_80;
  local_a8 = (QArrayData *)((ulong)local_a8 & 0xffffffff00000000);
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[26]>
            (local_80,(BoardSize *)&local_a8,(char (*) [26])"Load image for board  4x4");
  local_a8 = (QArrayData *)((ulong)local_a8 & 0xffffffff00000000);
  pmVar6 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[]((map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
                         *)p_Var3,(key_type *)&local_a8);
  QAbstractButton::setChecked(SUB81(pmVar6,0));
  p_Var3 = local_80;
  local_a8._0_4_ = 1;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[26]>
            (local_80,(BoardSize *)&local_a8,(char (*) [26])"Load Image for board  5x5");
  local_a8._0_4_ = 1;
  pmVar6 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[]((map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
                         *)p_Var3,(key_type *)&local_a8);
  QAbstractButton::setChecked(SUB81(pmVar6,0));
  p_Var3 = local_80;
  local_a8._0_4_ = 2;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[26]>
            (local_80,(BoardSize *)&local_a8,(char (*) [26])"Load image for board  6x6");
  local_a8._0_4_ = 2;
  pmVar6 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[]((map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
                         *)p_Var3,(key_type *)&local_a8);
  QAbstractButton::setChecked(SUB81(pmVar6,0));
  p_Var3 = local_80;
  local_a8._0_4_ = 3;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[26]>
            (local_80,(BoardSize *)&local_a8,(char (*) [26])"Load image for board  7x7");
  pGVar2 = local_b0;
  local_a8 = (QArrayData *)CONCAT44(local_a8._4_4_,3);
  pmVar6 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[]((map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
                         *)p_Var3,(key_type *)&local_a8);
  QAbstractButton::setChecked(SUB81(pmVar6,0));
  p_Var7 = (pGVar2->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      QVar18.m_data = (storage_type *)0x10;
      QVar18.m_size = (qsizetype)&local_a8;
      QString::fromUtf8(QVar18);
      local_c8.d.d = (Data *)local_a8;
      local_c8.d.ptr = pcStack_a0;
      QWidget::setStyleSheet((QString *)&p_Var7[1]._M_parent);
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  this_01 = local_60;
  local_a8 = (QArrayData *)((ulong)local_a8 & 0xffffffff00000000);
  std::
  _Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
  ::_M_emplace_unique<NumberColor,char_const(&)[28]>
            (local_60,(NumberColor *)&local_a8,(char (*) [28])"Number on graphic tile : No");
  local_a8._0_4_ = 1;
  std::
  _Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
  ::_M_emplace_unique<NumberColor,char_const(&)[31]>
            (this_01,(NumberColor *)&local_a8,(char (*) [31])"Number on graphic tile : Black");
  local_a8 = (QArrayData *)CONCAT44(local_a8._4_4_,2);
  std::
  _Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
  ::_M_emplace_unique<NumberColor,char_const(&)[31]>
            (this_01,(NumberColor *)&local_a8,(char (*) [31])"Number on graphic tile : White");
  pmVar8 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[]((map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
                         *)this_01,&(local_b0->currentOptions).numberColor);
  QAbstractButton::setChecked(SUB81(pmVar8,0));
  pQVar9 = (QButtonGroup *)operator_new(0x10);
  QButtonGroup::QButtonGroup(pQVar9,(QObject *)0x0);
  p_Var7 = (local_b0->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var7 != local_78) {
    do {
      QVar19.m_data = (storage_type *)0x10;
      QVar19.m_size = (qsizetype)&local_a8;
      QString::fromUtf8(QVar19);
      local_c8.d.d = (Data *)local_a8;
      local_c8.d.ptr = pcStack_a0;
      QWidget::setStyleSheet((QString *)&p_Var7[1]._M_parent);
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
        }
      }
      QButtonGroup::addButton((QAbstractButton *)pQVar9,(int)&p_Var7[1]._M_parent);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_78);
  }
  pQVar10 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar10);
  iVar14 = (int)pQVar10;
  QBoxLayout::addSpacing(iVar14);
  local_a8 = (QArrayData *)((ulong)local_a8 & 0xffffffff00000000);
  pmVar5 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[]((map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
                         *)local_70,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar5,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_a8._0_4_ = 1;
  pmVar5 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[]((map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
                         *)local_70,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar5,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_a8._0_4_ = 0;
  pmVar6 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[]((map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
                         *)local_80,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar6,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_a8._0_4_ = 1;
  pmVar6 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[]((map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
                         *)local_80,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar6,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_a8._0_4_ = 2;
  pmVar6 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[]((map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
                         *)local_80,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar6,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_a8._0_4_ = 3;
  pmVar6 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[]((map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
                         *)local_80,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar6,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_a8._0_4_ = 0;
  pmVar8 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[]((map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
                         *)local_60,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar8,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_a8._0_4_ = 1;
  pmVar8 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[]((map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
                         *)local_60,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar8,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_a8 = (QArrayData *)CONCAT44(local_a8._4_4_,2);
  pmVar8 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[]((map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
                         *)local_60,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar8,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_78 = (_Base_ptr)operator_new(0x28);
  QVar20.m_data = (storage_type *)0x19;
  QVar20.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar20);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  QGroupBox::QGroupBox((QGroupBox *)local_78,&local_c8,(QWidget *)0x0);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  QWidget::setLayout((QLayout *)local_78);
  this_00 = local_68;
  local_a8 = (QArrayData *)((ulong)local_a8 & 0xffffffff00000000);
  std::
  _Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
  ::_M_emplace_unique<TileColor,char_const(&)[5]>
            (local_68,(TileColor *)&local_a8,(char (*) [5])"Blue");
  local_a8._0_4_ = 1;
  std::
  _Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
  ::_M_emplace_unique<TileColor,char_const(&)[6]>
            (this_00,(TileColor *)&local_a8,(char (*) [6])"Green");
  local_a8 = (QArrayData *)CONCAT44(local_a8._4_4_,2);
  std::
  _Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
  ::_M_emplace_unique<TileColor,char_const(&)[4]>
            (this_00,(TileColor *)&local_a8,(char (*) [4])"Red");
  pmVar11 = std::
            map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
            ::operator[]((map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
                          *)this_00,&(local_b0->currentOptions).squareColor);
  QAbstractButton::setChecked(SUB81(pmVar11,0));
  pQVar9 = (QButtonGroup *)operator_new(0x10);
  QButtonGroup::QButtonGroup(pQVar9,(QObject *)0x0);
  p_Var7 = (local_b0->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var7 != local_40) {
    do {
      QVar21.m_data = (storage_type *)0x10;
      QVar21.m_size = (qsizetype)&local_a8;
      QString::fromUtf8(QVar21);
      local_c8.d.d = (Data *)local_a8;
      local_c8.d.ptr = pcStack_a0;
      QWidget::setStyleSheet((QString *)&p_Var7[1]._M_parent);
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
        }
      }
      QButtonGroup::addButton((QAbstractButton *)pQVar9,(int)&p_Var7[1]._M_parent);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_40);
  }
  pQVar10 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar10);
  iVar14 = (int)pQVar10;
  QBoxLayout::addSpacing(iVar14);
  local_a8 = (QArrayData *)((ulong)local_a8 & 0xffffffff00000000);
  pmVar11 = std::
            map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
            ::operator[]((map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
                          *)local_68,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar11,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_a8._0_4_ = 1;
  pmVar11 = std::
            map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
            ::operator[]((map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
                          *)local_68,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar11,0,0);
  QBoxLayout::addSpacing(iVar14);
  local_a8 = (QArrayData *)CONCAT44(local_a8._4_4_,2);
  pmVar11 = std::
            map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
            ::operator[]((map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
                          *)local_68,(key_type *)&local_a8);
  QBoxLayout::addWidget(pQVar10,pmVar11,0,0);
  QBoxLayout::addSpacing(iVar14);
  this_02 = (QGroupBox *)operator_new(0x28);
  QVar22.m_data = (storage_type *)0x16;
  QVar22.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar22);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  QGroupBox::QGroupBox(this_02,&local_c8,(QWidget *)0x0);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  QWidget::setLayout((QLayout *)this_02);
  pQVar12 = (QSlider *)operator_new(0x28);
  pGVar2 = local_b0;
  QSlider::QSlider(pQVar12,Horizontal,(QWidget *)local_b0);
  pGVar2->slider = pQVar12;
  QAbstractSlider::setRange((int)pQVar12,0);
  QAbstractSlider::setSingleStep((int)local_b0->slider);
  pQVar12 = local_b0->slider;
  Maps::getSliderByTileSize((local_b0->currentOptions).tileSize);
  QAbstractSlider::setValue((int)pQVar12);
  this_03 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_03,(QWidget *)0x0);
  QLayout::setContentsMargins((int)this_03,10,0x14,0x1e);
  QGridLayout::addWidget(this_03,local_b0->slider,0,0,1,5,0);
  pQVar13 = (QLabel *)operator_new(0x28);
  QVar23.m_data = (storage_type *)0x3;
  QVar23.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar23);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  QLabel::QLabel(pQVar13,&local_c8,0,0);
  QGridLayout::addWidget(this_03,pQVar13,1,0,1,1,1);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar13 = (QLabel *)operator_new(0x28);
  QVar24.m_data = (storage_type *)0x5;
  QVar24.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar24);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  QLabel::QLabel(pQVar13,&local_c8,0,0);
  QGridLayout::addWidget(this_03,pQVar13,1,1,1,1,1);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar13 = (QLabel *)operator_new(0x28);
  QVar25.m_data = (storage_type *)0x3;
  QVar25.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar25);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  QLabel::QLabel(pQVar13,&local_c8,0,0);
  QGridLayout::addWidget(this_03,pQVar13,1,2,1,1,0x84);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar13 = (QLabel *)operator_new(0x28);
  QVar26.m_data = (storage_type *)0x5;
  QVar26.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar26);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  QLabel::QLabel(pQVar13,&local_c8,0,0);
  QGridLayout::addWidget(this_03,pQVar13,1,3,1,1,2);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar13 = (QLabel *)operator_new(0x28);
  QVar27.m_data = (storage_type *)0x3;
  QVar27.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar27);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  QLabel::QLabel(pQVar13,&local_c8,0,0);
  QGridLayout::addWidget(this_03,pQVar13,1,4,1,1,2);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  this_04 = (QGroupBox *)operator_new(0x28);
  QVar28.m_data = (storage_type *)0xc;
  QVar28.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar28);
  local_c8.d.d = (Data *)local_a8;
  local_c8.d.ptr = pcStack_a0;
  local_c8.d.size = CONCAT44(uStack_94,local_98);
  QGroupBox::QGroupBox(this_04,&local_c8,(QWidget *)0x0);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  QWidget::setLayout((QLayout *)this_04);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)&local_a8);
  this_05 = (QPushButton *)operator_new(0x28);
  QVar29.m_data = (storage_type *)0x6;
  QVar29.m_size = (qsizetype)&local_c8;
  QString::fromUtf8(QVar29);
  local_58.d.d = local_c8.d.d;
  local_58.d.ptr = local_c8.d.ptr;
  local_58.d.size = local_c8.d.size;
  QPushButton::QPushButton(this_05,&local_58,(QWidget *)0x0);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  QVar30.m_data = (storage_type *)0xc;
  QVar30.m_size = (qsizetype)&local_c8;
  QString::fromUtf8(QVar30);
  local_58.d.d = local_c8.d.d;
  local_58.d.ptr = local_c8.d.ptr;
  local_58.d.size = local_c8.d.size;
  QWidget::setStyleSheet((QString *)this_05);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  QObject::connect(local_38,(char *)this_05,(QObject *)"2clicked()",(char *)local_b0,0x117d52);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  this_06 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_06);
  iVar14 = (int)this_06;
  QBoxLayout::addSpacing(iVar14);
  QBoxLayout::addWidget(this_06,this_05,0,0);
  QBoxLayout::addSpacing(iVar14);
  QBoxLayout::addSpacing((int)&local_a8);
  QBoxLayout::addWidget(&local_a8,local_78,0,0);
  QBoxLayout::addSpacing((int)&local_a8);
  QBoxLayout::addWidget(&local_a8,this_02,0,0);
  QBoxLayout::addSpacing((int)&local_a8);
  QBoxLayout::addWidget(&local_a8,this_04,0,0);
  QBoxLayout::addSpacing((int)&local_a8);
  QBoxLayout::addLayout((QLayout *)&local_a8,iVar14);
  QBoxLayout::addSpacing((int)&local_a8);
  QBoxLayout::addStretch((int)&local_a8);
  QWidget::setLayout((QLayout *)local_b0);
  QWidget::show();
  QVBoxLayout::~QVBoxLayout((QVBoxLayout *)&local_a8);
  return;
}

Assistant:

GUISetting::GUISetting( Fifteen& owner, BoardMode boardMode ) : owner( owner ), boardMode( boardMode )
{
    setModal( true );
    setWindowTitle( "" );
    setGeometry( 100, 100, 400, 560 );
    setMaximumSize( 400, 800 );
    setMinimumSize( 400, 800 );
    setAttribute( Qt::WA_DeleteOnClose );

    currentOptions = Options::readOptions();

    /* Graphic loading box *****************************************/

    mapGraphicMode.emplace( GraphicMode::SCALED, "Scalled image");
    mapGraphicMode[GraphicMode::SCALED].setStyleSheet( STYLE_MARGIN_LEFT );
    
    mapGraphicMode.emplace( GraphicMode::CROPPED, "Cropped image" );
    mapGraphicMode[GraphicMode::CROPPED].setStyleSheet( STYLE_MARGIN_LEFT );
    mapGraphicMode[currentOptions.graphicMode].setChecked( true );

    mapImageToLoad.emplace( BoardSize::FOUR, "Load image for board  4x4" );
    mapImageToLoad[BoardSize::FOUR].setChecked( currentOptions.imageToLoad_4 );
    
    mapImageToLoad.emplace( BoardSize::FIVE, "Load Image for board  5x5" );
    mapImageToLoad[BoardSize::FIVE].setChecked( currentOptions.imageToLoad_5 );
    
    mapImageToLoad.emplace( BoardSize::SIX, "Load image for board  6x6" );
    mapImageToLoad[BoardSize::SIX].setChecked( currentOptions.imageToLoad_6 );
    
    mapImageToLoad.emplace( BoardSize::SEVEN, "Load image for board  7x7" );
    mapImageToLoad[BoardSize::SEVEN].setChecked( currentOptions.imageToLoad_7 );

    for ( auto& checkBox : mapImageToLoad | std::views::values )
    {
        checkBox.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    mapNumberOnImage.emplace( NumberColor::NO, "Number on graphic tile : No" );
    mapNumberOnImage.emplace( NumberColor::BLACK, "Number on graphic tile : Black" );
    mapNumberOnImage.emplace( NumberColor::WHITE, "Number on graphic tile : White" );
    mapNumberOnImage[currentOptions.numberColor].setChecked( true );

    QButtonGroup* groupNumberOnImage = new QButtonGroup();
    for ( auto& radio : mapNumberOnImage | std::views::values )
    {
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
        groupNumberOnImage->addButton( &radio );
    }

    QVBoxLayout* layoutImages = new QVBoxLayout();
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapGraphicMode[GraphicMode::SCALED] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapGraphicMode[GraphicMode::CROPPED] );
    layoutImages->addSpacing( 15 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::FOUR] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::FIVE] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::SIX] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::SEVEN] );
    layoutImages->addSpacing( 15 );
    layoutImages->addWidget( &mapNumberOnImage[NumberColor::NO] );
    layoutImages->addSpacing( 12 );
    layoutImages->addWidget( &mapNumberOnImage[NumberColor::BLACK] );
    layoutImages->addSpacing( 12 );
    layoutImages->addWidget( &mapNumberOnImage[NumberColor::WHITE] );
    layoutImages->addSpacing( 15 );

    QGroupBox* boxRadioImage = new QGroupBox( "Image for a graphic board" );
    boxRadioImage->setLayout( layoutImages );

    /* Color of numeric board **************************************/

    mapTileColor.emplace(TileColor::BLUE, "Blue" );
    mapTileColor.emplace(TileColor::GREEN, "Green" );
    mapTileColor.emplace(TileColor::RED, "Red" );
    mapTileColor[currentOptions.squareColor].setChecked( true );

    QButtonGroup* groupRadioColor = new QButtonGroup();
    for ( auto& radio : mapTileColor | std::views::values )
    {
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
        groupRadioColor->addButton( &radio );
    }   

    QVBoxLayout* layoutTileColor = new QVBoxLayout();
    layoutTileColor->addSpacing( 7 );
    layoutTileColor->addWidget( &mapTileColor[TileColor::BLUE] );
    layoutTileColor->addSpacing( 7 );
    layoutTileColor->addWidget( &mapTileColor[TileColor::GREEN] );
    layoutTileColor->addSpacing( 7 );
    layoutTileColor->addWidget( &mapTileColor[TileColor::RED] );
    layoutTileColor->addSpacing( 7 );

    QGroupBox* boxRadioColor = new QGroupBox( "Color of numeric board" );
    boxRadioColor->setLayout( layoutTileColor );

    /* Slider for square size **************************************/

    slider = new QSlider( Qt::Horizontal, this );
    slider->setRange( 0, 4 );
    slider->setSingleStep( 1 );
    slider->setValue( Maps::getSliderByTileSize( currentOptions.tileSize ));

    QGridLayout* layoutSlider = new QGridLayout();
    layoutSlider->setContentsMargins( 10, 20, 30, 20 );
    layoutSlider->addWidget( slider,          0, 0, 1, 5 );
    layoutSlider->addWidget( new QLabel( " 50" ),   1, 0, 1, 1, Qt::AlignLeft );
    layoutSlider->addWidget( new QLabel( "   75" ), 1, 1, 1, 1, Qt::AlignLeft );
    layoutSlider->addWidget( new QLabel( "100" ),   1, 2, 1, 1, Qt::AlignCenter );
    layoutSlider->addWidget( new QLabel( "125  " ), 1, 3, 1, 1, Qt::AlignRight );
    layoutSlider->addWidget( new QLabel( "150" ),   1, 4, 1, 1, Qt::AlignRight );

    QGroupBox* boxSquareSize = new QGroupBox( "Size of tile" );
    boxSquareSize->setLayout( layoutSlider );

    /* General layout **********************************************/

    QVBoxLayout layWindow;

    QPushButton* pushAccept = new QPushButton( "Accept" );
    pushAccept->setStyleSheet( "height:20px;" );
    connect( pushAccept, SIGNAL( clicked() ), this, SLOT( acceptSettings() ));

    QHBoxLayout* layoutAccept = new QHBoxLayout();
    layoutAccept->addSpacing( 120 );
    layoutAccept->addWidget( pushAccept );
    layoutAccept->addSpacing( 120 );

    layWindow.addSpacing( 20 );
    layWindow.addWidget( boxRadioImage );
    layWindow.addSpacing( 20 );
    layWindow.addWidget( boxRadioColor);
    layWindow.addSpacing( 20 );
    layWindow.addWidget( boxSquareSize );
    layWindow.addSpacing( 20 );
    layWindow.addLayout( layoutAccept );
    layWindow.addSpacing( 10 );
    layWindow.addStretch();

    this->setLayout( &layWindow );
    this->show();
}